

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXBigInteger.cpp
# Opt level: O0

Block ZXing::GetShiftedBlock(Magnitude *num,size_t x,size_t y)

{
  size_type sVar1;
  const_reference pvVar2;
  long in_RDX;
  size_type in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  Block part2;
  Block part1;
  undefined8 local_40;
  undefined8 local_30;
  
  if ((in_RSI == 0) || (in_RDX == 0)) {
    local_30 = 0;
  }
  else {
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (in_RDI,in_RSI - 1);
    local_30 = *pvVar2 >> (0x40 - (byte)in_RDX & 0x3f);
  }
  sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDI);
  if (in_RSI == sVar1) {
    local_40 = 0;
  }
  else {
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RDI,in_RSI);
    local_40 = *pvVar2 << ((byte)in_RDX & 0x3f);
  }
  return local_30 | local_40;
}

Assistant:

static Block GetShiftedBlock(const Magnitude& num, size_t x, size_t y)
{
	Block part1 = (x == 0 || y == 0) ? Block(0) : (num[x - 1] >> (NB_BITS - y));
	Block part2 = (x == num.size()) ? Block(0) : (num[x] << y);
	return part1 | part2;
}